

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

int __thiscall libtorrent::rename(libtorrent *this,char *__old,char *__new)

{
  _Alloc_hider __old_00;
  _Alloc_hider __new_00;
  int iVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  native_path_string f1;
  native_path_string f2;
  string local_58;
  string local_38;
  
  __new[0] = '\0';
  __new[1] = '\0';
  __new[2] = '\0';
  __new[3] = '\0';
  __new[4] = '\0';
  *(system_error_category **)(__new + 8) =
       &boost::system::detail::cat_holder<void>::system_category_instance;
  convert_to_native(&local_58,(string *)this);
  convert_to_native(&local_38,(string *)__old);
  __new_00._M_p = local_38._M_dataplus._M_p;
  __old_00._M_p = local_58._M_dataplus._M_p;
  if (((local_58._M_string_length != local_38._M_string_length) ||
      ((local_58._M_string_length != 0 &&
       (iVar1 = bcmp(local_58._M_dataplus._M_p,local_38._M_dataplus._M_p,local_58._M_string_length),
       iVar1 != 0)))) && (iVar1 = ::rename(__old_00._M_p,__new_00._M_p), iVar1 < 0)) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *(int *)__new = iVar1;
    __new[4] = iVar1 != 0;
    *(generic_error_category **)(__new + 8) =
         &boost::system::detail::cat_holder<void>::generic_category_instance;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar3) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    paVar3 = extraout_RAX;
  }
  return (int)paVar3;
}

Assistant:

void rename(std::string const& inf, std::string const& newf, error_code& ec)
	{
		ec.clear();

		native_path_string f1 = convert_to_native_path_string(inf);
		native_path_string f2 = convert_to_native_path_string(newf);

		if (f1 == f2) return;

#if defined TORRENT_WINDOWS
#define RenameFunction_ ::_wrename
#else
#define RenameFunction_ ::rename
#endif

		if (RenameFunction_(f1.c_str(), f2.c_str()) < 0)
		{
			ec.assign(errno, generic_category());
		}
#undef RenameFunction_
	}